

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O0

int __thiscall HighsHashTree<int,_void>::NodePtr::numEntriesEstimate(NodePtr *this)

{
  Type TVar1;
  logic_error *this_00;
  NodePtr *in_RDI;
  int local_4;
  
  TVar1 = getType(in_RDI);
  switch(TVar1) {
  case kEmpty:
    local_4 = 0;
    break;
  case kListLeaf:
    local_4 = 1;
    break;
  case kInnerLeafSizeClass1:
    local_4 = InnerLeaf<1>::capacity();
    break;
  case kInnerLeafSizeClass2:
    local_4 = InnerLeaf<2>::capacity();
    break;
  case kInnerLeafSizeClass3:
    local_4 = InnerLeaf<3>::capacity();
    break;
  case kInnerLeafSizeClass4:
    local_4 = InnerLeaf<4>::capacity();
    break;
  case kBranchNode:
    local_4 = 0x40;
    break;
  default:
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"Unexpected type in hash tree");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return local_4;
}

Assistant:

int numEntriesEstimate() const {
      switch (getType()) {
        case kEmpty:
          return 0;
        case kListLeaf:
          return 1;
        case kInnerLeafSizeClass1:
          return InnerLeaf<1>::capacity();
        case kInnerLeafSizeClass2:
          return InnerLeaf<2>::capacity();
        case kInnerLeafSizeClass3:
          return InnerLeaf<3>::capacity();
        case kInnerLeafSizeClass4:
          return InnerLeaf<4>::capacity();
        case kBranchNode:
          // something large should be returned so that the number of entries
          // is estimated above the threshold to merge when the parent checks
          // its children after deletion
          return kBranchFactor;
        default:
          throw std::logic_error("Unexpected type in hash tree");
      }
    }